

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindNormalProgramDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  pointer pbVar1;
  bool bVar2;
  pointer name;
  pointer path;
  cmFindProgramHelper helper;
  allocator<char> local_c9;
  pointer local_c8;
  undefined1 local_c0 [144];
  
  cmFindProgramHelper::cmFindProgramHelper((cmFindProgramHelper *)local_c0);
  name = (this->super_cmFindBase).Names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (name == local_c8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_c9);
LAB_001dc525:
      cmFindProgramHelper::~cmFindProgramHelper((cmFindProgramHelper *)local_c0);
      return __return_storage_ptr__;
    }
    cmFindProgramHelper::SetName((cmFindProgramHelper *)local_c0,name);
    bVar2 = cmFindProgramHelper::CheckCompoundNames((cmFindProgramHelper *)local_c0);
    if (bVar2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_c0 + 0x18));
      goto LAB_001dc525;
    }
    path = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (path != pbVar1) {
      bVar2 = cmFindProgramHelper::CheckDirectory((cmFindProgramHelper *)local_c0,path);
      path = path + 1;
      if (bVar2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_c0 + 0x18));
        goto LAB_001dc525;
      }
    }
    name = name + 1;
  } while( true );
}

Assistant:

std::string cmFindProgramCommand::FindNormalProgramDirsPerName()
{
  // Search the entire path for each name.
  cmFindProgramHelper helper;
  for (std::string const& n : this->Names) {
    // Switch to searching for this name.
    helper.SetName(n);

    // Check for the names themselves if they contain a directory separator.
    if (helper.CheckCompoundNames()) {
      return helper.BestPath;
    }

    // Search every directory.
    for (std::string const& sp : this->SearchPaths) {
      if (helper.CheckDirectory(sp)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the program.
  return "";
}